

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Reader.hh
# Opt level: O0

void __thiscall
avro::ReaderImpl<avro::NullValidator>::readValue(ReaderImpl<avro::NullValidator> *this,float *val)

{
  undefined4 *in_RSI;
  BufferReader *in_RDI;
  anon_union_4_2_947300a4 v;
  uint *in_stack_ffffffffffffffd8;
  undefined4 local_14;
  
  NullValidator::checkTypeExpected((NullValidator *)(in_RDI + 1),AVRO_FLOAT);
  BufferReader::read<unsigned_int>(in_RDI,in_stack_ffffffffffffffd8);
  *in_RSI = local_14;
  return;
}

Assistant:

void readValue(float &val) {
        validator_.checkTypeExpected(AVRO_FLOAT);
        union { 
            float f;
            uint32_t i;
        } v;
        reader_.read(v.i);
        val = v.f;
    }